

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_conn.c
# Opt level: O3

void nni_http_prune_body(nng_http *conn)

{
  long lVar1;
  nng_http_req *pnVar2;
  _Bool *p_Var3;
  
  if (conn->client == true) {
    pnVar2 = &conn->req;
    p_Var3 = &(conn->req).data.own;
    lVar1 = 0x410;
    if ((conn->req).data.own == false) goto LAB_00139e20;
  }
  else {
    pnVar2 = (nng_http_req *)&conn->res;
    p_Var3 = &(conn->res).data.own;
    lVar1 = 0x538;
    if ((conn->res).data.own != true) goto LAB_00139e20;
  }
  nni_free((pnVar2->data).data,*(size_t *)((long)&conn->sock + lVar1));
LAB_00139e20:
  *p_Var3 = false;
  (pnVar2->data).data = (char *)0x0;
  (pnVar2->data).size = 0;
  return;
}

Assistant:

void
nni_http_prune_body(nng_http *conn)
{
	// prune body but leave content-length header intact.
	// This is for HEAD.
	if (conn->client) {
		http_set_data(&conn->req.data, NULL, 0);
	} else {
		http_set_data(&conn->res.data, NULL, 0);
	}
}